

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_bind_zeroblob(sqlite3_stmt *pStmt,int i,int n)

{
  int iVar1;
  
  iVar1 = vdbeUnbind((Vdbe *)pStmt,i);
  if (iVar1 == 0) {
    sqlite3VdbeMemSetZeroBlob((Mem *)(*(long *)(pStmt + 0x68) + (long)i * 0x38 + -0x38),n);
    if (*(sqlite3_mutex **)(*(long *)pStmt + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
    }
  }
  return iVar1;
}

Assistant:

SQLITE_STDCALL sqlite3_bind_zeroblob(sqlite3_stmt *pStmt, int i, int n){
  int rc;
  Vdbe *p = (Vdbe *)pStmt;
  rc = vdbeUnbind(p, i);
  if( rc==SQLITE_OK ){
    sqlite3VdbeMemSetZeroBlob(&p->aVar[i-1], n);
    sqlite3_mutex_leave(p->db->mutex);
  }
  return rc;
}